

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QImage>::emplace<QImage>
          (QMovableArrayOps<QImage> *this,qsizetype i,QImage *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  QImage *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QImage tmp;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9e;
  byte bVar6;
  Inserter *this_00;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QImage>::needsDetach((QArrayDataPointer<QImage> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QImage>::freeSpaceAtEnd
                          ((QArrayDataPointer<QImage> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT24(in_stack_ffffffffffffff9c,
                                                            in_stack_ffffffffffffff98)))),
       qVar3 != 0)) {
      QArrayDataPointer<QImage>::end((QArrayDataPointer<QImage> *)in_RDI);
      QImage::QImage((QImage *)in_RDI,
                     (QImage *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      in_RDI->displaceTo = in_RDI->displaceTo + 1;
      goto LAB_0010a512;
    }
    if ((in_RSI == (QImage *)0x0) &&
       (qVar3 = QArrayDataPointer<QImage>::freeSpaceAtBegin
                          ((QArrayDataPointer<QImage> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT24(in_stack_ffffffffffffff9c,
                                                            in_stack_ffffffffffffff98)))),
       qVar3 != 0)) {
      QArrayDataPointer<QImage>::begin((QArrayDataPointer<QImage> *)0x10a3d4);
      QImage::QImage((QImage *)in_RDI,
                     (QImage *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      in_RDI->displaceFrom = in_RDI->displaceFrom + -0x18;
      in_RDI->displaceTo = in_RDI->displaceTo + 1;
      goto LAB_0010a512;
    }
  }
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)in_RDI,
                 (QImage *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  bVar4 = in_RDI->displaceTo != (QImage *)0x0;
  uVar5 = bVar4 && in_RSI == (QImage *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QImage *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QImage>::detachAndGrow
            ((QArrayDataPointer<QImage> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (QImage **)CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff9c,uVar2))),
             (QArrayDataPointer<QImage> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QImage> *)
                              CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff9c,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar5,in_stack_ffffffffffffff88));
    Inserter::insertOne(in_RDI,(QImage *)CONCAT17(uVar5,in_stack_ffffffffffffff88));
    Inserter::~Inserter(in_RDI);
  }
  else {
    QArrayDataPointer<QImage>::begin((QArrayDataPointer<QImage> *)0x10a4a6);
    QImage::QImage((QImage *)in_RDI,(QImage *)CONCAT17(uVar5,in_stack_ffffffffffffff88));
    in_RDI->displaceFrom = in_RDI->displaceFrom + -0x18;
    in_RDI->displaceTo = in_RDI->displaceTo + 1;
  }
  QImage::~QImage((QImage *)&local_20);
LAB_0010a512:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }